

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall
Code_domain_impl::_do_equivalent
          (Code_domain_impl *this,status_code<void> *code1,status_code<void> *code2)

{
  value_type vVar1;
  bool bVar2;
  status_code_domain *psVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  generic_code *c2_1;
  StatusCode *c2;
  StatusCode *c1;
  status_code<void> *code2_local;
  status_code<void> *code1_local;
  Code_domain_impl *this_local;
  
  psVar3 = system_error2::status_code<void>::domain(code1);
  bVar2 = system_error2::status_code_domain::operator==(psVar3,&this->super_status_code_domain);
  if (!bVar2) {
    __assert_fail("code1.domain() == *this",
                  "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/test/main.cpp"
                  ,0xab,
                  "virtual bool Code_domain_impl::_do_equivalent(const system_error2::status_code<void> &, const system_error2::status_code<void> &) const"
                 );
  }
  psVar3 = system_error2::status_code<void>::domain(code2);
  bVar2 = system_error2::status_code_domain::operator==(psVar3,&this->super_status_code_domain);
  if (bVar2) {
    pvVar4 = system_error2::detail::status_code_storage<Code_domain_impl>::value
                       ((status_code_storage<Code_domain_impl> *)code1);
    vVar1 = *pvVar4;
    pvVar4 = system_error2::detail::status_code_storage<Code_domain_impl>::value
                       ((status_code_storage<Code_domain_impl> *)code2);
    return vVar1 == *pvVar4;
  }
  psVar3 = system_error2::status_code<void>::domain(code2);
  bVar2 = system_error2::status_code_domain::operator==
                    (psVar3,(status_code_domain *)system_error2::generic_code_domain);
  if (bVar2) {
    pvVar4 = system_error2::detail::status_code_storage<Code_domain_impl>::value
                       ((status_code_storage<Code_domain_impl> *)code1);
    switch(*pvVar4) {
    case success1:
    case success2:
      pvVar5 = system_error2::detail::status_code_storage<system_error2::_generic_code_domain>::
               value((status_code_storage<system_error2::_generic_code_domain> *)code2);
      this_local._7_1_ = *pvVar5 == success;
      break;
    case goaway:
      pvVar5 = system_error2::detail::status_code_storage<system_error2::_generic_code_domain>::
               value((status_code_storage<system_error2::_generic_code_domain> *)code2);
      if ((*pvVar5 == operation_not_permitted) || (*pvVar5 == permission_denied)) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    case error2:
      this_local._7_1_ = false;
      break;
    default:
      goto switchD_001090e1_default;
    }
  }
  else {
switchD_001090e1_default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool _do_equivalent(const system_error2::status_code<void> &code1,
                              const system_error2::status_code<void> &code2) const noexcept override final  // NOLINT
  {
    assert(code1.domain() == *this);
    const auto &c1 = static_cast<const StatusCode &>(code1);  // NOLINT
    if(code2.domain() == *this)
    {
      const auto &c2 = static_cast<const StatusCode &>(code2);  // NOLINT
      return c1.value() == c2.value();
    }
    // If the other category is generic
    if(code2.domain() == system_error2::generic_code_domain)
    {
      const auto &c2 = static_cast<const system_error2::generic_code &>(code2);  // NOLINT
      switch(c1.value())
      {
      case Code::success1:
      case Code::success2:
        return static_cast<system_error2::errc>(c2.value()) == system_error2::errc::success;
      case Code::goaway:
        switch(static_cast<system_error2::errc>(c2.value()))
        {
        case system_error2::errc::permission_denied:
        case system_error2::errc::operation_not_permitted:
          return true;
        default:
          return false;
        }
      case Code::error2:
        return false;
      }
    }
    return false;
  }